

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Message>::~ExceptionOr
          (ExceptionOr<kj::HttpInputStream::Message> *this)

{
  ExceptionOr<kj::HttpInputStream::Message> *this_local;
  
  Maybe<kj::HttpInputStream::Message>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}